

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O0

loader_handle mock_loader_impl_load_from_file(loader_impl impl,loader_path *paths,size_t size)

{
  ulong in_RDX;
  long in_RSI;
  size_t iterator;
  loader_impl_mock_handle handle;
  ulong local_30;
  undefined8 *local_8;
  
  local_8 = (undefined8 *)malloc(8);
  if (local_8 == (undefined8 *)0x0) {
    local_8 = (undefined8 *)0x0;
  }
  else {
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      log_write_impl_va("metacall",0x154,"mock_loader_impl_load_from_file",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                        ,0,"Mock module %s loaded from file",in_RSI + local_30 * 0x1000);
    }
    *local_8 = 0;
  }
  return local_8;
}

Assistant:

loader_handle mock_loader_impl_load_from_file(loader_impl impl, const loader_path paths[], size_t size)
{
	loader_impl_mock_handle handle = malloc(sizeof(struct loader_impl_mock_handle_type));

	(void)impl;

	if (handle != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < size; ++iterator)
		{
			log_write("metacall", LOG_LEVEL_DEBUG, "Mock module %s loaded from file", paths[iterator]);
		}

		handle->handle_mock_data = NULL;

		return (loader_handle)handle;
	}

	return NULL;
}